

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall libserver::server::_process_request_(server *this)

{
  char *__dest;
  char *pcVar1;
  long lVar2;
  allocator<char> local_99;
  string m;
  string msg;
  allocator<char> local_58 [32];
  string local_38 [32];
  
  __dest = this->_incomming_message;
  msg._M_dataplus._M_p._0_1_ = 10;
  pcVar1 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (__dest,this->_incomming_message + this->_num_bytes_read);
  if (pcVar1 != (char *)0x0) {
    m._M_dataplus._M_p._0_1_ = 10;
    pcVar1 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (__dest,__dest + this->_num_bytes_read);
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,__dest,pcVar1);
    lVar2 = (long)this->_num_bytes_read;
    if (lVar2 != 0x400) {
      memmove(__dest,this->_incomming_message + lVar2,0x400 - lVar2);
    }
    m._M_dataplus._M_p._0_1_ = 10;
    pcVar1 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (__dest,this->_incomming_message + lVar2);
    this->_num_bytes_read = this->_num_bytes_read + ((int)__dest - (int)pcVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&m,"lo",local_58);
    lVar2 = std::__cxx11::string::find((string *)&msg,(ulong)&m);
    std::__cxx11::string::~string((string *)&m);
    if (lVar2 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,"lo",(allocator<char> *)local_38);
      std::__cxx11::string::substr((ulong)&m,(ulong)&msg);
      std::__cxx11::string::operator=((string *)&this->client_name,(string *)&m);
      std::__cxx11::string::~string((string *)&m);
      std::__cxx11::string::~string((string *)local_58);
      _handle_login_req(this);
      _update_client_changed();
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&m,"ping",local_58);
      lVar2 = std::__cxx11::string::find((string *)&msg,(ulong)&m);
      std::__cxx11::string::~string((string *)&m);
      if (lVar2 == 0) {
        _handle_ping_req(this);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&m,"list",local_58);
        lVar2 = std::__cxx11::string::find((string *)&msg,(ulong)&m);
        std::__cxx11::string::~string((string *)&m);
        if (lVar2 == 0) {
          _handle_list_request(this);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&m,"echo",local_58);
          lVar2 = std::__cxx11::string::find((string *)&msg,(ulong)&m);
          std::__cxx11::string::~string((string *)&m);
          if (lVar2 == 0) {
            m._M_dataplus._M_p = (pointer)&m.field_2;
            m._M_string_length = 0;
            m.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::string<std::allocator<char>>(local_38,"echo",&local_99);
            std::__cxx11::string::substr((ulong)local_58,(ulong)&msg);
            std::__cxx11::string::operator=((string *)&m,(string *)local_58);
            std::__cxx11::string::~string((string *)local_58);
            std::__cxx11::string::~string(local_38);
            _display_message(this,&m);
            std::__cxx11::string::~string((string *)&m);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void libserver::server::_process_request_()
{
    /*
        Check if complete message is read till newline character
        Handle the corresponding request
    */
    if(std::find(_incomming_message,_incomming_message+_num_bytes_read,'\n'))
    {

        // Store the message in a std::string container
        std::string msg(_incomming_message,(std::find(_incomming_message,_incomming_message+_num_bytes_read,'\n')-_incomming_message));

        // Copy the read message into buffer (_incomming_message)
        std::copy(_incomming_message+_num_bytes_read,_incomming_message+_MAX_BUF_SIZE_,_incomming_message);

        _num_bytes_read -= (std::find(_incomming_message,_incomming_message+_num_bytes_read,'\n')-_incomming_message);
        if(msg.find(_LOGIN_REQUEST_)==0)
        {   
            client_name = msg.substr((_LOGIN_REQUEST_).length());
            _handle_login_req();
            libserver::_update_client_changed();
        }
        else if(msg.find(_PING_REQUEST_)==0)
        {
            _handle_ping_req();
        }
        else if(msg.find(_REQ_CLIENT_LIST_) == 0)
        {
            _handle_list_request();
        }
        else if(msg.find(_REQ_ECHO_)==0)
        {
            std::string m;
            m = msg.substr((_REQ_ECHO_).length());
            _display_message(m);
        }
    }
}